

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> **ppRVar1;
  Disposer *pDVar2;
  Compiler *pCVar3;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar4;
  PathPtr path;
  String *pSVar5;
  int iVar6;
  Maybe<const_kj::ReadableDirectory_&> dir;
  Maybe<capnp::compiler::Module_&> module;
  uint64_t id;
  undefined4 extraout_var;
  RemoveConst<capnp::compiler::CompilerMain::SourceFile> *pRVar7;
  size_t extraout_RDX;
  long lVar8;
  size_t sVar9;
  DirPathPair dirPathPair;
  String local_68;
  DirPathPair local_50;
  
  if (this->compilerConstructed == false) {
    Compiler::Compiler((Compiler *)&this->compilerSpace,this->annotationFlag);
    pDVar2 = (this->compiler).disposer;
    pCVar3 = (this->compiler).ptr;
    (this->compiler).disposer =
         (Disposer *)&kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::instance;
    (this->compiler).ptr = (Compiler *)&this->compilerSpace;
    if (pCVar3 != (Compiler *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pCVar3->super_LazyLoadCallback)._vptr_LazyLoadCallback[-2] +
                        (long)&(pCVar3->super_LazyLoadCallback)._vptr_LazyLoadCallback);
    }
    this->compilerConstructed = true;
  }
  if (this->addStandardImportPaths == true) {
    lVar8 = 0;
    do {
      dir = getSourceDirectory(this,(StringPtr)
                                    *(ArrayPtr<const_char> *)
                                     ((long)&addSource::STANDARD_IMPORT_PATHS[0].content.ptr + lVar8
                                     ),false);
      if (dir.ptr != (ReadableDirectory *)0x0) {
        ModuleLoader::addImportPath(&this->loader,dir.ptr);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
    this->addStandardImportPaths = false;
  }
  interpretSourceFile(&local_50,this,file);
  path.parts.size_ = local_50.path.parts.size_;
  path.parts.ptr = local_50.path.parts.ptr;
  module = ModuleLoader::loadModule(&this->loader,local_50.dir,path);
  if (module.ptr == (Module *)0x0) {
    kj::heapString(&local_68,"no such file",0xc);
    (__return_storage_ptr__->errorMessage).ptr.isSet = true;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_68.content.ptr;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_68.content.size_;
    (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
         local_68.content.disposer;
  }
  else {
    id = Compiler::add((this->compiler).ptr,module.ptr);
    Compiler::eagerlyCompile((this->compiler).ptr,id,this->compileEagerness);
    iVar6 = (*((module.ptr)->super_ErrorReporter)._vptr_ErrorReporter[2])(module.ptr);
    pRVar7 = (this->sourceFiles).builder.pos;
    if (pRVar7 == (this->sourceFiles).builder.endPtr) {
      pRVar4 = (this->sourceFiles).builder.ptr;
      sVar9 = 4;
      if (pRVar7 != pRVar4) {
        sVar9 = (long)pRVar7 - (long)pRVar4 >> 4;
      }
      kj::Vector<capnp::compiler::CompilerMain::SourceFile>::setCapacity(&this->sourceFiles,sVar9);
      pRVar7 = (this->sourceFiles).builder.pos;
    }
    pRVar7->id = id;
    (pRVar7->name).content.ptr = (char *)CONCAT44(extraout_var,iVar6);
    (pRVar7->name).content.size_ = extraout_RDX;
    pRVar7->module = module.ptr;
    ppRVar1 = &(this->sourceFiles).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  sVar9 = local_50.path.parts.size_;
  pSVar5 = local_50.path.parts.ptr;
  if (local_50.path.parts.ptr != (String *)0x0) {
    local_50.path.parts.ptr = (String *)0x0;
    local_50.path.parts.size_ = 0;
    (**(local_50.path.parts.disposer)->_vptr_ArrayDisposer)
              (local_50.path.parts.disposer,pSVar5,0x18,sVar9,sVar9,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_MAYBE(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(*dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_MAYBE(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      uint64_t id = compiler->add(*module);
      compiler->eagerlyCompile(id, compileEagerness);
      sourceFiles.add(SourceFile { id, module->getSourceName(), &*module });
    } else {
      return "no such file";
    }